

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsModule.c
# Opt level: O0

cs_err Mips_global_init(cs_struct *ud)

{
  void *pvVar1;
  long in_RDI;
  MCRegisterInfo *mri;
  MCRegisterInfo *in_stack_00000020;
  
  pvVar1 = (*cs_mem_malloc)(0x58);
  Mips_init(in_stack_00000020);
  *(code **)(in_RDI + 8) = Mips_printInst;
  *(void **)(in_RDI + 0x10) = pvVar1;
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(code **)(in_RDI + 0x28) = Mips_reg_name;
  *(code **)(in_RDI + 0x40) = Mips_get_insn_id;
  *(code **)(in_RDI + 0x30) = Mips_insn_name;
  *(code **)(in_RDI + 0x38) = Mips_group_name;
  *(code **)(in_RDI + 0x18) = Mips_getInstruction;
  return CS_ERR_OK;
}

Assistant:

cs_err Mips_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	Mips_init(mri);
	ud->printer = Mips_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->reg_name = Mips_reg_name;
	ud->insn_id = Mips_get_insn_id;
	ud->insn_name = Mips_insn_name;
	ud->group_name = Mips_group_name;

	ud->disasm = Mips_getInstruction;

	return CS_ERR_OK;
}